

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O1

TargetList *
Analyser::Static::Coleco::GetTargets
          (TargetList *__return_storage_ptr__,Media *media,string *param_2,IntType param_3)

{
  uchar uVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer pSVar4;
  pointer puVar5;
  vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
  *pvVar6;
  pointer puVar7;
  Cartridge *pCVar8;
  pointer psVar9;
  ulong uVar10;
  size_type __new_size;
  __single_object target;
  vector<unsigned_char,_std::allocator<unsigned_char>_> truncated_data;
  vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
  output_segments;
  _Head_base<0UL,_Analyser::Static::Target_*,_false> local_a0;
  vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
  *local_98;
  Cartridge *local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  local_68;
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = (vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
              *)__return_storage_ptr__;
  local_a0._M_head_impl = (Target *)operator_new(0x80);
  (local_a0._M_head_impl)->_vptr_Target = (_func_int **)&PTR__Target_00593fe0;
  ((local_a0._M_head_impl)->state)._M_t.
  super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>._M_t.
  super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
  super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl = (Struct *)0x0;
  (local_a0._M_head_impl)->machine = ColecoVision;
  ((local_a0._M_head_impl)->media).disks.
  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_a0._M_head_impl)->media).disks.
  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_a0._M_head_impl)->media).disks.
  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_a0._M_head_impl)->media).tapes.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_a0._M_head_impl)->media).tapes.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_a0._M_head_impl)->media).tapes.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_a0._M_head_impl)->media).cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_a0._M_head_impl)->media).cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_a0._M_head_impl)->media).cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_a0._M_head_impl)->media).mass_storage_devices.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_a0._M_head_impl)->media).mass_storage_devices.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_a0._M_head_impl)->media).mass_storage_devices.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_a0._M_head_impl)->confidence = 0.0;
  (local_a0._M_head_impl)->confidence = 0.9999695;
  local_68.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar9 = (media->cartridges).
           super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (media->cartridges).
           super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar9 != psVar2) {
    do {
      peVar3 = (psVar9->
               super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      pSVar4 = (peVar3->segments_).
               super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)(peVar3->segments_).
                super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 == 0x28) {
        puVar5 = *(pointer *)
                  &(pSVar4->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
        puVar7 = (pSVar4->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar10 = (long)puVar7 - (long)puVar5;
        puVar7 = puVar7 + -0x4000;
        if ((uVar10 & 0xffffffffffffe000) < 0x8001) {
          puVar7 = puVar5;
        }
        uVar1 = *puVar7;
        if (((((uVar1 == 'U') || (uVar1 == 0xaa)) || (puVar7[1] == 0xaa)) || (puVar7[1] == 'U')) &&
           (uVar1 != puVar7[1])) {
          local_48.
          super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&local_88,&pSVar4->data);
          __new_size = (-(int)uVar10 & 0x1fff) + uVar10;
          if ((uVar10 & 0xfffffffffffffe00) == 0x8000) {
            __new_size = 0x8000;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_88,__new_size);
          local_90 = (Cartridge *)CONCAT44(local_90._4_4_,0x8000);
          std::
          vector<Storage::Cartridge::Cartridge::Segment,std::allocator<Storage::Cartridge::Cartridge::Segment>>
          ::emplace_back<int,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                    ((vector<Storage::Cartridge::Cartridge::Segment,std::allocator<Storage::Cartridge::Cartridge::Segment>>
                      *)&local_48,(int *)&local_90,&local_88);
          pCVar8 = (Cartridge *)operator_new(0x20);
          pCVar8->_vptr_Cartridge = (_func_int **)&PTR__Cartridge_00594838;
          std::
          vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
          ::vector(&pCVar8->segments_,
                   (vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
                    *)&local_48);
          local_90 = pCVar8;
          std::
          vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>
          ::emplace_back<Storage::Cartridge::Cartridge*>
                    ((vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>
                      *)&local_68,&local_90);
          if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
          ::~vector((vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
                     *)&local_48);
        }
      }
      psVar9 = psVar9 + 1;
    } while (psVar9 != psVar2);
  }
  local_48.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       ((local_a0._M_head_impl)->media).cartridges.
       super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       ((local_a0._M_head_impl)->media).cartridges.
       super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       ((local_a0._M_head_impl)->media).cartridges.
       super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_a0._M_head_impl)->media).cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ((local_a0._M_head_impl)->media).cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ((local_a0._M_head_impl)->media).cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ::~vector(&local_48);
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ::~vector(&local_68);
  pvVar6 = local_98;
  if (((((local_a0._M_head_impl)->media).disks.
        super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        ((local_a0._M_head_impl)->media).disks.
        super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) ||
      (((local_a0._M_head_impl)->media).tapes.
       super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       ((local_a0._M_head_impl)->media).tapes.
       super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) ||
     ((((local_a0._M_head_impl)->media).cartridges.
       super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       ((local_a0._M_head_impl)->media).cartridges.
       super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ||
      (((local_a0._M_head_impl)->media).mass_storage_devices.
       super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       ((local_a0._M_head_impl)->media).mass_storage_devices.
       super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)))) {
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              (local_98,(unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                         *)&local_a0);
  }
  if (local_a0._M_head_impl != (Target *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_Target[1])();
  }
  return (TargetList *)pvVar6;
}

Assistant:

Analyser::Static::TargetList Analyser::Static::Coleco::GetTargets(const Media &media, const std::string &, TargetPlatform::IntType) {
	TargetList targets;
	auto target = std::make_unique<Target>(Machine::ColecoVision);
	target->confidence = 1.0f - 1.0f / 32768.0f;
	target->media.cartridges = ColecoCartridgesFrom(media.cartridges);
	if(!target->media.empty())
		targets.push_back(std::move(target));
	return targets;
}